

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O1

void Ioa_WriteAigerEncodeStr(Vec_Str_t *vStr,uint x)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar4 = (ulong)x;
  if (0x7f < x) {
    do {
      uVar3 = vStr->nCap;
      if (vStr->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar2 = (char *)malloc(0x10);
          }
          else {
            pcVar2 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar2;
          sVar5 = 0x10;
        }
        else {
          sVar5 = (ulong)uVar3 * 2;
          if ((int)sVar5 <= (int)uVar3) goto LAB_007df45e;
          if (vStr->pArray == (char *)0x0) {
            pcVar2 = (char *)malloc(sVar5);
          }
          else {
            pcVar2 = (char *)realloc(vStr->pArray,sVar5);
          }
          vStr->pArray = pcVar2;
        }
        vStr->nCap = (int)sVar5;
      }
LAB_007df45e:
      uVar3 = (uint)uVar4;
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      vStr->pArray[iVar1] = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
    } while (0x3fff < uVar3);
  }
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar2;
      sVar5 = 0x10;
    }
    else {
      sVar5 = (ulong)uVar3 * 2;
      if ((int)sVar5 <= (int)uVar3) goto LAB_007df4f0;
      if (vStr->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(sVar5);
      }
      else {
        pcVar2 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar2;
    }
    vStr->nCap = (int)sVar5;
  }
LAB_007df4f0:
  iVar1 = vStr->nSize;
  vStr->nSize = iVar1 + 1;
  vStr->pArray[iVar1] = (char)uVar4;
  return;
}

Assistant:

void Ioa_WriteAigerEncodeStr( Vec_Str_t * vStr, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
//        putc (ch, file);
//        pBuffer[Pos++] = ch;
        Vec_StrPush( vStr, ch );
        x >>= 7;
    }
    ch = x;
//    putc (ch, file);
//    pBuffer[Pos++] = ch;
    Vec_StrPush( vStr, ch );
}